

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.hpp
# Opt level: O0

void __thiscall
SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::ServerBase
          (ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this,
          unsigned_short port)

{
  unordered_set<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*,_std::hash<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::equal_to<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::allocator<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>_>
  *this_00;
  mutex *this_01;
  ScopeRunner *this_02;
  unsigned_short port_local;
  ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this_local;
  
  this->_vptr_ServerBase = (_func_int **)&PTR__ServerBase_0029df28;
  Config::Config(&this->config,port);
  std::
  map<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::regex_orderable,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response>,_std::shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response>,_std::shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request>)>_>_>_>,_std::less<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::regex_orderable>,_std::allocator<std::pair<const_SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::regex_orderable,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response>,_std::shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response>,_std::shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request>)>_>_>_>_>_>_>
  ::map(&this->resource);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response>,_std::shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response>,_std::shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request>)>_>_>_>
  ::map(&this->default_resource);
  std::
  function<void_(std::shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request>,_const_std::error_code_&)>
  ::function(&this->on_error);
  std::
  function<void_(std::unique_ptr<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>_&,_std::shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Request>)>
  ::function(&this->on_upgrade);
  std::shared_ptr<asio::io_context>::shared_ptr(&this->io_service);
  this->internal_io_service = false;
  std::
  unique_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>>>
  ::unique_ptr<std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>>,void>
            ((unique_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>>>
              *)&this->acceptor);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->threads);
  this_00 = (unordered_set<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*,_std::hash<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::equal_to<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::allocator<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>_>
             *)operator_new(0x38);
  *(undefined8 *)&(this_00->_M_h)._M_rehash_policy = 0;
  (this_00->_M_h)._M_rehash_policy._M_next_resize = 0;
  (this_00->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this_00->_M_h)._M_element_count = 0;
  (this_00->_M_h)._M_buckets = (__buckets_ptr)0x0;
  (this_00->_M_h)._M_bucket_count = 0;
  (this_00->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_set<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*,_std::hash<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::equal_to<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::allocator<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>_>
  ::unordered_set(this_00);
  std::
  shared_ptr<std::unordered_set<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*,std::hash<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*>,std::equal_to<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*>,std::allocator<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*>>>
  ::
  shared_ptr<std::unordered_set<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*,std::hash<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*>,std::equal_to<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*>,std::allocator<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*>>,void>
            ((shared_ptr<std::unordered_set<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*,std::hash<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*>,std::equal_to<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*>,std::allocator<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Connection*>>>
              *)&this->connections,this_00);
  this_01 = (mutex *)operator_new(0x28);
  *(undefined8 *)((long)&(this_01->super___mutex_base)._M_mutex + 0x10) = 0;
  (this_01->super___mutex_base)._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this_01->super___mutex_base)._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this_01->super___mutex_base)._M_mutex + 8) = 0;
  (this_01->super___mutex_base)._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::mutex::mutex(this_01);
  std::shared_ptr<std::mutex>::shared_ptr<std::mutex,void>(&this->connections_mutex,this_01);
  this_02 = (ScopeRunner *)operator_new(8);
  ScopeRunner::ScopeRunner(this_02);
  std::shared_ptr<SimpleWeb::ScopeRunner>::shared_ptr<SimpleWeb::ScopeRunner,void>
            (&this->handler_runner,this_02);
  return;
}

Assistant:

ServerBase(unsigned short port) noexcept : config(port), connections(new std::unordered_set<Connection *>()), connections_mutex(new std::mutex()), handler_runner(new ScopeRunner()) {}